

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O0

int Saig_ManRetimeUnsatCore(Aig_Man_t *p,int fVerbose)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Sto_Man_t *pCnf_00;
  Intp_Man_t *p_01;
  Vec_Int_t *p_02;
  void *__s;
  void *pvVar4;
  uint local_90;
  uint local_8c;
  int nPos;
  int nVars;
  int iClause;
  int iBadPo;
  int RetValue;
  int i;
  int *pVars;
  int *pLit;
  int *pClause2;
  int *pClause1;
  Aig_Obj_t *pObj;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Vec_Int_t *vCore;
  Intp_Man_t *pManProof;
  void *pSatCnf;
  int nConfLimit;
  int fVeryVerbose;
  int fVerbose_local;
  Aig_Man_t *p_local;
  
  p_00 = Cnf_DeriveSimpleForRetiming(p);
  s = sat_solver_new();
  sat_solver_store_alloc(s);
  sat_solver_setnvars(s,p_00->nVars);
  for (iBadPo = 0; iBadPo < p_00->nClauses; iBadPo = iBadPo + 1) {
    iVar2 = sat_solver_addclause(s,p_00->pClauses[iBadPo],p_00->pClauses[iBadPo + 1]);
    if (iVar2 == 0) {
      Cnf_DataFree(p_00);
      sat_solver_delete(s);
      return -1;
    }
  }
  sat_solver_store_mark_roots(s);
  iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
  if (iVar2 == 0) {
    __assert_fail("RetValue != l_Undef",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigRetMin.c"
                  ,0x7d,"int Saig_ManRetimeUnsatCore(Aig_Man_t *, int)");
  }
  if (iVar2 == -1) {
    pCnf_00 = (Sto_Man_t *)sat_solver_store_release(s);
    sat_solver_delete(s);
    p_01 = Intp_ManAlloc();
    p_02 = (Vec_Int_t *)Intp_ManUnsatCore(p_01,pCnf_00,0,0);
    Intp_ManFree(p_01);
    Sto_ManFree(pCnf_00);
    local_8c = 0;
    __s = malloc((long)p_00->nVars << 2);
    memset(__s,0,(long)p_00->nVars << 2);
    for (iBadPo = 0; iVar2 = Vec_IntSize(p_02), iBadPo < iVar2; iBadPo = iBadPo + 1) {
      iVar2 = Vec_IntEntry(p_02,iBadPo);
      piVar1 = p_00->pClauses[iVar2 + 1];
      for (pVars = p_00->pClauses[iVar2]; pVars < piVar1; pVars = pVars + 1) {
        if (*(int *)((long)__s + (long)(*pVars >> 1) * 4) == 0) {
          local_8c = local_8c + 1;
        }
        *(undefined4 *)((long)__s + (long)(*pVars >> 1) * 4) = 1;
      }
    }
    local_90 = 0;
    nVars = -1;
    for (iBadPo = 0; iVar2 = Vec_PtrSize(p->vCos), iBadPo < iVar2; iBadPo = iBadPo + 1) {
      pvVar4 = Vec_PtrEntry(p->vCos,iBadPo);
      if ((-1 < p_00->pVarNums[*(int *)((long)pvVar4 + 0x24)]) &&
         (*(int *)((long)__s + (long)p_00->pVarNums[*(int *)((long)pvVar4 + 0x24)] * 4) == 1)) {
        if (nVars == -1) {
          nVars = iBadPo;
        }
        local_90 = local_90 + 1;
      }
    }
    if (fVerbose != 0) {
      uVar3 = Vec_IntSize(p_02);
      printf("UNSAT core: %d clauses, %d variables, %d POs.  ",(ulong)uVar3,(ulong)local_8c,
             (ulong)local_90);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    Vec_IntFree(p_02);
    Cnf_DataFree(p_00);
    return nVars;
  }
  __assert_fail("RetValue == l_False",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigRetMin.c"
                ,0x7e,"int Saig_ManRetimeUnsatCore(Aig_Man_t *, int)");
}

Assistant:

int Saig_ManRetimeUnsatCore( Aig_Man_t * p, int fVerbose )
{
    int fVeryVerbose = 0;
    int nConfLimit = 1000000;
    void * pSatCnf = NULL; 
    Intp_Man_t * pManProof;
    Vec_Int_t * vCore = NULL;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int * pClause1, * pClause2, * pLit, * pVars;
    int i, RetValue, iBadPo, iClause, nVars, nPos;
    // create the SAT solver
    pCnf = Cnf_DeriveSimpleForRetiming( p );
    pSat = sat_solver_new();
    sat_solver_store_alloc( pSat ); 
    sat_solver_setnvars( pSat, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnf );
            sat_solver_delete( pSat );
            return -1;
        }
    }
    sat_solver_store_mark_roots( pSat ); 
    // solve the problem
    RetValue = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    assert( RetValue != l_Undef );
    assert( RetValue == l_False );
    pSatCnf = sat_solver_store_release( pSat ); 
    sat_solver_delete( pSat );
    // derive the UNSAT core
    pManProof = Intp_ManAlloc();
    vCore = (Vec_Int_t *)Intp_ManUnsatCore( pManProof, (Sto_Man_t *)pSatCnf, 0, fVeryVerbose );
    Intp_ManFree( pManProof );
    Sto_ManFree( (Sto_Man_t *)pSatCnf );
    // derive the set of variables on which the core depends
    // collect the variable numbers
    nVars = 0;
    pVars = ABC_ALLOC( int, pCnf->nVars );
    memset( pVars, 0, sizeof(int) * pCnf->nVars );
    Vec_IntForEachEntry( vCore, iClause, i )
    {
        pClause1 = pCnf->pClauses[iClause];
        pClause2 = pCnf->pClauses[iClause+1];
        for ( pLit = pClause1; pLit < pClause2; pLit++ )
        {
            if ( pVars[ (*pLit) >> 1 ] == 0 )
                nVars++;
            pVars[ (*pLit) >> 1 ] = 1;
            if ( fVeryVerbose )
            printf( "%s%d ", ((*pLit) & 1)? "-" : "+", (*pLit) >> 1 );
        }
        if ( fVeryVerbose )
        printf( "\n" );
    }
    // collect the nodes
    if ( fVeryVerbose ) {
      Aig_ManForEachObj( p, pObj, i )
          if ( pCnf->pVarNums[pObj->Id] >= 0 && pVars[ pCnf->pVarNums[pObj->Id] ] == 1 )
          {
              Aig_ObjPrint( p, pObj );
              printf( "\n" );
          }
    }
    // pick the first PO in the list
    nPos = 0;
    iBadPo = -1;
    Aig_ManForEachCo( p, pObj, i )
        if ( pCnf->pVarNums[pObj->Id] >= 0 && pVars[ pCnf->pVarNums[pObj->Id] ] == 1 )
        {
            if ( iBadPo == -1 )
                iBadPo = i;
            nPos++;
        }
    if ( fVerbose )
        printf( "UNSAT core: %d clauses, %d variables, %d POs.  ", Vec_IntSize(vCore), nVars, nPos );
    ABC_FREE( pVars );
    Vec_IntFree( vCore );
    Cnf_DataFree( pCnf );
    return iBadPo;
}